

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O0

void __thiscall
axl::sl::
ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
::attach(ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
         *this,Hdr *hdr,
        AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::SwitchInfo_*>::GetBucketLink>
        *p,size_t count)

{
  RefCount *in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  
  if (in_RSI != in_RDI[1]) {
    if (in_RSI != 0) {
      rc::RefCount::addRef((RefCount *)0x13b4de);
    }
    if (in_RDI[1] != 0) {
      rc::RefCount::release(in_RCX);
    }
    in_RDI[1] = in_RSI;
  }
  *in_RDI = in_RDX;
  in_RDI[2] = in_RCX;
  return;
}

Assistant:

void
	attach(
		Hdr* hdr,
		T* p,
		size_t count
	) {
		if (hdr != m_hdr) { // try to avoid unnecessary interlocked ops
			if (hdr)
				hdr->addRef();

			if (m_hdr)
				m_hdr->release();

			m_hdr = hdr;
		}

		m_p = p;
		m_count = count;
	}